

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var __thiscall
Js::GlobalObject::ExecuteEvalParsedFunction
          (GlobalObject *this,ScriptFunction *pfuncScript,FrameDisplay *environment,Var *varThis,
          ScriptContext *scriptContext)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  JavascriptMethod p_Var5;
  Var pvVar6;
  
  if (pfuncScript == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2c5,"(pfuncScript != nullptr)","pfuncScript != nullptr");
    if (!bVar2) goto LAB_00a25334;
    *puVar3 = 0;
  }
  ScriptFunction::SetEnvironment(pfuncScript,environment);
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2c9,"(pfuncScript->GetFunctionBody())",
                                "pfuncScript->GetFunctionBody()");
    if (!bVar2) {
LAB_00a25334:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  if ((pFVar4->field_0x178 & 0x20) != 0) {
    ScriptFunction::InvalidateCachedScopeChain(pfuncScript);
  }
  this_00 = scriptContext->threadContext;
  bVar2 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
  ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)pfuncScript);
  CheckIsExecutable((RecyclableObject *)pfuncScript,p_Var5);
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)pfuncScript);
  pvVar6 = (*p_Var5)((RecyclableObject *)pfuncScript,(CallInfo)pfuncScript,0x4000001,0,0,0,0,
                     0x4000001,*varThis);
  this_00->reentrancySafeOrHandled = bVar2;
  ScriptFunction::SetEnvironment(pfuncScript,(FrameDisplay *)&NullFrameDisplay);
  return pvVar6;
}

Assistant:

Var GlobalObject::ExecuteEvalParsedFunction(ScriptFunction *pfuncScript, FrameDisplay* environment, Var &varThis, ScriptContext *scriptContext)
    {
        Assert(pfuncScript != nullptr);

        pfuncScript->SetEnvironment(environment);
        //This function is supposed to be deserialized
        Assert(pfuncScript->GetFunctionBody());
        if (pfuncScript->GetFunctionBody()->GetFuncEscapes())
        {
            // Executing the eval causes the scope chain to escape.
            pfuncScript->InvalidateCachedScopeChain();
        }
        Var varResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            varResult = CALL_FUNCTION(scriptContext->GetThreadContext(), pfuncScript, CallInfo(CallFlags_Eval, 1), varThis);
        }
        END_SAFE_REENTRANT_CALL
        pfuncScript->SetEnvironment((FrameDisplay*)&NullFrameDisplay);
        return varResult;
    }